

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O0

Tensor * __thiscall cnn::ComputationGraph::get_value(ComputationGraph *this,Expression *e)

{
  Tensor *pTVar1;
  ComputationGraph *in_RSI;
  VariableIndex *in_stack_ffffffffffffffe8;
  
  VariableIndex::VariableIndex
            ((VariableIndex *)&stack0xffffffffffffffec,
             (VariableIndex *)
             &(in_RSI->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish);
  pTVar1 = get_value(in_RSI,in_stack_ffffffffffffffe8);
  return pTVar1;
}

Assistant:

const Tensor& ComputationGraph::get_value(const expr::Expression& e) { return this->get_value(e.i); }